

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

void __thiscall blc::network::Socket::~Socket(Socket *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_stream)._vptr_stream = (_func_int **)&PTR_write_0011aba0;
  if (this->_opened == true) {
    ::close(this->_socket);
  }
  pcVar1 = (this->_address)._M_dataplus._M_p;
  paVar2 = &(this->_address).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

blc::network::Socket::~Socket() {
	if (this->_opened)
		::close(this->_socket);
}